

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPointer<QTextList>_>::moveAppend
          (QGenericArrayOps<QPointer<QTextList>_> *this,QPointer<QTextList> *b,
          QPointer<QTextList> *e)

{
  qsizetype *pqVar1;
  QPointer<QTextList> *pQVar2;
  QPointer<QTextList> *pQVar3;
  QObject *pQVar4;
  
  if (b != e) {
    pQVar3 = (this->super_QArrayDataPointer<QPointer<QTextList>_>).ptr;
    for (; b < e; b = b + 1) {
      pQVar4 = (b->wp).value;
      pQVar2 = pQVar3 + (this->super_QArrayDataPointer<QPointer<QTextList>_>).size;
      (pQVar2->wp).d = (b->wp).d;
      (pQVar2->wp).value = pQVar4;
      (b->wp).d = (Data *)0x0;
      (b->wp).value = (QObject *)0x0;
      pqVar1 = &(this->super_QArrayDataPointer<QPointer<QTextList>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }